

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ReadDataSection(WasmBinaryReader *this)

{
  code *pcVar1;
  WasmNode ie;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint sourceContextId;
  FunctionInfo *pFVar5;
  WasmBinaryReader *this_00;
  ulong uVar6;
  WasmBinaryReader *pWVar7;
  FunctionBody *pFVar8;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 auStack_70 [8];
  WasmNode initExpr;
  uint32 local_3c;
  uint local_38;
  uint32 len;
  
  local_3c = 0;
  pWVar7 = this;
  len = LEB128<unsigned_int,32u>(this,&local_3c);
  if ((100000 < len) && (DAT_015932e2 == '\0')) {
    ThrowDecodingError(pWVar7,L"Too many data segments");
  }
  if (len != 0) {
    Js::WebAssemblyModule::AllocateDataSegs(this->m_module,len);
    initExpr.field_1._16_8_ = __tls_get_addr(&PTR_01548f08);
    uVar6 = 0;
    do {
      pWVar7 = this;
      uVar4 = LEB128<unsigned_int,32u>(this,&local_3c);
      if (uVar4 != 0) {
        uVar6 = (ulong)uVar4;
LAB_00f1288a:
        ThrowDecodingError(pWVar7,L"Unknown memory index %u",uVar6);
      }
      if (((this->m_module->field_0x20 & 2) == 0) &&
         ((this->m_module->m_memImport).ptr == (WasmImport *)0x0)) {
        uVar6 = 0;
        goto LAB_00f1288a;
      }
      pFVar8 = (this->m_funcState).body;
      if (pFVar8 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmReaderPhase);
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
        if (this->m_readerState == READER_STATE_FUNCTION) {
          pFVar8 = (this->m_funcState).body;
        }
        else {
          pFVar8 = (FunctionBody *)0x0;
        }
        pFVar5 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar5 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          local_38 = sourceContextId;
          Js::Throw::LogAssert();
          uVar2 = initExpr.field_1._16_8_;
          *(undefined4 *)initExpr.field_1._16_8_ = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)uVar2 = 0;
          pFVar5 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
          sourceContextId = local_38;
        }
        bVar3 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,WasmReaderPhase,sourceContextId,
                           pFVar5->functionId);
      }
      if (bVar3 != false) {
        Output::Print(L"Data Segment #%u",uVar6);
        Output::Print(L"\n");
        Output::Flush();
      }
      ReadInitExpr((WasmNode *)auStack_70,this,true);
      uVar4 = LEB128<unsigned_int,32u>(this,&local_3c);
      this_00 = (WasmBinaryReader *)new<Memory::ArenaAllocator>(0x38,this->m_alloc,0x364470);
      ie.field_1.block = initExpr.field_1.block;
      ie.op = initExpr.op;
      ie._2_6_ = initExpr._2_6_;
      ie.field_1.brTable.targetTable = initExpr.field_1.brTable.targetTable;
      ie.field_1._16_8_ = in_stack_ffffffffffffff88;
      pWVar7 = this_00;
      WasmDataSegment::WasmDataSegment((WasmDataSegment *)this_00,this->m_alloc,ie,uVar4,this->m_pc)
      ;
      if ((uint)(*(int *)&this->m_end - (int)this->m_pc) < uVar4) {
        ThrowDecodingError(pWVar7,L"Out of file: Needed: %d, Left: %d",(ulong)uVar4);
      }
      this->m_pc = this->m_pc + uVar4;
      Js::WebAssemblyModule::SetDataSeg(this->m_module,(WasmDataSegment *)this_00,(uint32)uVar6);
      uVar4 = (uint32)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (len != uVar4);
  }
  return;
}

Assistant:

void WasmBinaryReader::ReadDataSection()
{
    uint32 len = 0;
    const uint32 numSegments = LEB128(len);
    if (numSegments > Limits::GetMaxDataSegments())
    {
        ThrowDecodingError(_u("Too many data segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateDataSegs(numSegments);
    }

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(len);
        if (index != 0 || !(m_module->HasMemory() || m_module->HasMemoryImport()))
        {
            ThrowDecodingError(_u("Unknown memory index %u"), index);
        }
        TRACE_WASM_DECODER(_u("Data Segment #%u"), i);
        WasmNode initExpr = ReadInitExpr(true);
        uint32 dataByteLen = LEB128(len);

        WasmDataSegment* dseg = Anew(m_alloc, WasmDataSegment, m_alloc, initExpr, dataByteLen, m_pc);
        CheckBytesLeft(dataByteLen);
        m_pc += dataByteLen;
        m_module->SetDataSeg(dseg, i);
    }
}